

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_from_storage(secp256k1_ge *r,secp256k1_ge_storage *a)

{
  secp256k1_fe_storage *in_RSI;
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_impl_from_storage(in_RDI,in_RSI);
  secp256k1_fe_impl_from_storage(in_RDI + 1,in_RSI + 1);
  *(undefined4 *)in_RDI[2].n = 0;
  secp256k1_ge_verify((secp256k1_ge *)0x948e1a);
  return;
}

Assistant:

static void secp256k1_ge_from_storage(secp256k1_ge *r, const secp256k1_ge_storage *a) {
    secp256k1_fe_from_storage(&r->x, &a->x);
    secp256k1_fe_from_storage(&r->y, &a->y);
    r->infinity = 0;

    SECP256K1_GE_VERIFY(r);
}